

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int eval_expr_select(lyxp_expr *exp,uint16_t *exp_idx,lyxp_expr_type etype,lyd_node *cur_node,
                    lys_module *param_5,lyxp_set *set,int options)

{
  lyxp_expr_type *plVar1;
  lys_node *plVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  lyxp_expr *plVar5;
  lyxp_expr_type lVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  lyxp_set_node *plVar12;
  char *pcVar13;
  long lVar14;
  lyxp_set *plVar15;
  ushort uVar16;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  ly_ctx *plVar20;
  uint16_t equal_exp;
  ushort uVar21;
  short sVar22;
  uint unaff_R12D;
  uint uVar23;
  ushort *exp_idx_00;
  lys_module *plVar24;
  undefined1 auStack_f8 [8];
  lyxp_set orig_set;
  lyxp_set local_a8;
  char *local_60;
  ushort *local_58;
  lys_module *local_50;
  lyd_node *local_48;
  lyxp_expr *local_40;
  lyxp_set *local_38;
  
  uVar9 = (ulong)*exp_idx;
  plVar1 = exp->repeat[uVar9];
  lVar6 = LYXP_EXPR_NONE;
  if (plVar1 != (lyxp_expr_type *)0x0) {
    uVar19 = CONCAT62((int6)((ulong)exp_idx >> 0x10),0xffff);
    do {
      uVar18 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar18;
      uVar21 = (ushort)uVar18;
    } while (etype < plVar1[uVar21]);
    lVar6 = LYXP_EXPR_NONE;
    if (uVar21 != 0) {
      lVar6 = plVar1[(uVar18 & 0xffff) - 1];
      uVar23 = 0;
      do {
        unaff_R12D = uVar23;
        if (plVar1[(uVar18 - uVar23 & 0xffff) - 1] != lVar6) break;
        uVar23 = uVar23 + 1;
        unaff_R12D = uVar18;
      } while (uVar21 != (ushort)uVar23);
    }
  }
  uVar21 = (ushort)unaff_R12D;
  local_58 = exp_idx;
  local_50 = param_5;
  local_48 = cur_node;
  local_40 = exp;
  local_38 = set;
  switch(lVar6) {
  case LYXP_EXPR_NONE:
    switch(exp->tokens[uVar9]) {
    case LYXP_TOKEN_PAR1:
      pcVar17 = "parsed";
      if (set == (lyxp_set *)0x0) {
        pcVar17 = "skipped";
      }
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_path_expr",pcVar17,"(",(ulong)exp->expr_pos[uVar9]);
      exp_idx = local_58;
      *local_58 = *local_58 + 1;
      iVar7 = eval_expr_select(exp,local_58,LYXP_EXPR_NONE,cur_node,local_50,set,options);
      if (iVar7 == -1) {
        return -1;
      }
      if (iVar7 == 1) {
        return 1;
      }
      if (local_40->tokens[*exp_idx] != LYXP_TOKEN_PAR2) {
        __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_PAR2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1dd4,
                      "int eval_path_expr(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      iVar7 = 0;
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_path_expr",pcVar17,")",
                 (ulong)local_40->expr_pos[*exp_idx]);
      *exp_idx = *exp_idx + 1;
      goto LAB_0017763b;
    default:
      plVar20 = param_5->ctx;
      pcVar17 = print_token(exp->tokens[uVar9]);
      ly_vlog(plVar20,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar17,
              exp->expr + exp->expr_pos[*exp_idx]);
      return -1;
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
      iVar7 = 0;
      goto LAB_001760d4;
    case LYXP_TOKEN_FUNCNAME:
      plVar15 = set;
      if (set == (lyxp_set *)0x0) {
        plVar15 = (lyxp_set *)0x0;
      }
      iVar7 = eval_function_call(exp,exp_idx,cur_node,param_5,plVar15,options);
      break;
    case LYXP_TOKEN_OPERATOR_PATH:
      iVar7 = eval_absolute_location_path(exp,exp_idx,cur_node,param_5,set,options);
      goto LAB_001760d9;
    case LYXP_TOKEN_LITERAL:
      plVar15 = set;
      if (set == (lyxp_set *)0x0 || (options & 0x1cU) != 0) {
        if ((set != (lyxp_set *)0x0) && (uVar18 = set->used, (ulong)uVar18 != 0)) {
          lVar14 = 0;
          do {
            if (*(int *)((long)&((set->val).nodes)->pos + lVar14) == 1) {
              *(undefined4 *)((long)&((set->val).nodes)->pos + lVar14) = 0;
            }
            lVar14 = lVar14 + 0x10;
          } while ((ulong)uVar18 << 4 != lVar14);
        }
        plVar15 = (lyxp_set *)0x0;
      }
      eval_literal(exp,exp_idx,plVar15);
      goto LAB_00177635;
    case LYXP_TOKEN_NUMBER:
      if (set == (lyxp_set *)0x0 || (options & 0x1cU) != 0) {
        if ((set != (lyxp_set *)0x0) && (uVar18 = set->used, (ulong)uVar18 != 0)) {
          lVar14 = 0;
          do {
            if (*(int *)((long)&((set->val).nodes)->pos + lVar14) == 1) {
              *(undefined4 *)((long)&((set->val).nodes)->pos + lVar14) = 0;
            }
            lVar14 = lVar14 + 0x10;
          } while ((ulong)uVar18 << 4 != lVar14);
        }
        plVar20 = param_5->ctx;
        plVar15 = (lyxp_set *)0x0;
      }
      else {
        plVar20 = param_5->ctx;
        plVar15 = set;
      }
      iVar7 = eval_number(plVar20,exp,exp_idx,plVar15);
    }
    if (iVar7 != 0) {
      return iVar7;
    }
LAB_00177635:
    iVar7 = 1;
LAB_0017763b:
    while( true ) {
      set = local_38;
      uVar21 = *exp_idx;
      if (local_40->used <= uVar21) {
        return 0;
      }
      if (local_40->tokens[uVar21] != LYXP_TOKEN_BRACK1) break;
      iVar8 = eval_predicate(local_40,exp_idx,local_48,local_50,local_38,options,iVar7);
      if (iVar8 != 0) {
        return iVar8;
      }
    }
    if (local_40->used <= uVar21) {
      return 0;
    }
    if (local_40->tokens[uVar21] != LYXP_TOKEN_OPERATOR_PATH) {
      return 0;
    }
    iVar7 = 0;
    if (local_40->tok_len[uVar21] != 1) {
      if (local_40->tok_len[uVar21] != 2) {
        __assert_fail("exp->tok_len[*exp_idx] == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1e35,
                      "int eval_path_expr(struct lyxp_expr *, uint16_t *, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      iVar7 = 1;
    }
    pcVar17 = "parsed";
    if (local_38 == (lyxp_set *)0x0) {
      pcVar17 = "skipped";
    }
    pcVar13 = print_token(LYXP_TOKEN_OPERATOR_PATH);
    exp = local_40;
    exp_idx = local_58;
    ly_log_dbg(8,"%-27s %s %s[%u]","eval_path_expr",pcVar17,pcVar13,
               (ulong)local_40->expr_pos[*local_58]);
    *exp_idx = *exp_idx + 1;
LAB_001760d4:
    iVar7 = eval_relative_location_path(exp,exp_idx,local_48,local_50,iVar7,set,options);
LAB_001760d9:
    if (iVar7 == 0) {
      return 0;
    }
    return iVar7;
  case LYXP_EXPR_OR:
    if (uVar21 == 0) {
      __assert_fail("repeat",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x206c,
                    "int eval_or_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    orig_set.ht = (hash_table *)0x0;
    orig_set.ctx_pos = 0;
    orig_set.ctx_size = 0;
    orig_set.val._8_8_ = 0;
    orig_set.used = 0;
    orig_set.size = 0;
    orig_set._8_8_ = 0;
    orig_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_f8 = (undefined1  [8])0x0;
    orig_set.type = LYXP_SET_EMPTY;
    orig_set._4_4_ = 0;
    local_a8.type = LYXP_SET_EMPTY;
    local_a8._4_4_ = 0;
    local_a8._8_8_ = 0;
    local_a8.val.nodes = (lyxp_set_node *)0x0;
    local_a8.val._8_8_ = 0;
    local_a8.used = 0;
    local_a8.size = 0;
    local_a8.ht = (hash_table *)0x0;
    local_a8.ctx_pos = 0;
    local_a8.ctx_size = 0;
    local_a8._56_8_ = 0;
    set_fill_set((lyxp_set *)auStack_f8,set);
    iVar7 = eval_expr_select(local_40,exp_idx,LYXP_EXPR_OR,cur_node,param_5,local_38,options);
    if (iVar7 != 0) goto LAB_00176bfc;
    if ((options & 0x1cU) == 0 || local_38 == (lyxp_set *)0x0) {
      lyxp_set_cast(local_38,LYXP_SET_BOOLEAN,cur_node,local_50,options);
    }
    else {
      uVar18 = local_38->used;
      if ((ulong)uVar18 != 0) {
        lVar14 = 0;
        do {
          if (*(int *)((long)&((local_38->val).nodes)->pos + lVar14) == 1) {
            *(undefined4 *)((long)&((local_38->val).nodes)->pos + lVar14) = 0;
          }
          lVar14 = lVar14 + 0x10;
        } while ((ulong)uVar18 << 4 != lVar14);
      }
    }
    uVar18 = 1;
    if (1 < uVar21) {
      uVar18 = unaff_R12D;
    }
    local_58 = (ushort *)CONCAT44(local_58._4_4_,uVar18);
    sVar22 = 0;
    do {
      plVar24 = local_50;
      if (local_40->tokens[*exp_idx] != LYXP_TOKEN_OPERATOR_LOG) {
        __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_LOG",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x2081,
                      "int eval_or_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      pcVar17 = "skipped";
      if ((local_38 != (lyxp_set *)0x0) && (pcVar17 = "skipped", (local_38->val).bool == 0)) {
        pcVar17 = "parsed";
      }
      pcVar13 = print_token(LYXP_TOKEN_OPERATOR_LOG);
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_or_expr",pcVar17,pcVar13);
      cur_node = local_48;
      *exp_idx = *exp_idx + 1;
      if ((local_38 == (lyxp_set *)0x0) ||
         ((local_38->type == LYXP_SET_BOOLEAN && ((local_38->val).bool != 0)))) {
        iVar7 = eval_expr_select(local_40,exp_idx,LYXP_EXPR_OR,local_48,plVar24,(lyxp_set *)0x0,
                                 options);
        if (iVar7 != 0) goto LAB_00176bfc;
      }
      else {
        set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
        cur_node = local_48;
        iVar7 = eval_expr_select(local_40,exp_idx,LYXP_EXPR_OR,local_48,plVar24,&local_a8,options);
        plVar15 = local_38;
        if (iVar7 != 0) goto LAB_00176bfc;
        if (local_38->type == LYXP_SET_SNODE_SET) {
          if ((local_a8._32_8_ & 0xffffffff) != 0) {
            lVar14 = 0;
            do {
              if (*(int *)((long)&(local_a8.val.nodes)->pos + lVar14) == 1) {
                *(undefined4 *)((long)&(local_a8.val.nodes)->pos + lVar14) = 0;
              }
              lVar14 = lVar14 + 0x10;
            } while ((local_a8._32_8_ & 0xffffffff) << 4 != lVar14);
          }
          set_snode_merge(local_38,&local_a8);
        }
        else {
          lyxp_set_cast(&local_a8,LYXP_SET_BOOLEAN,cur_node,local_50,options);
          set_fill_set(plVar15,&local_a8);
        }
      }
      sVar22 = sVar22 + 1;
    } while (sVar22 != (short)local_58);
    goto LAB_00177374;
  case LYXP_EXPR_AND:
    if (uVar21 == 0) {
      __assert_fail("repeat",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x201e,
                    "int eval_and_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    orig_set.ht = (hash_table *)0x0;
    orig_set.ctx_pos = 0;
    orig_set.ctx_size = 0;
    orig_set.val._8_8_ = 0;
    orig_set.used = 0;
    orig_set.size = 0;
    orig_set._8_8_ = 0;
    orig_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_f8 = (undefined1  [8])0x0;
    orig_set.type = LYXP_SET_EMPTY;
    orig_set._4_4_ = 0;
    local_a8.type = LYXP_SET_EMPTY;
    local_a8._4_4_ = 0;
    local_a8._8_8_ = 0;
    local_a8.val.nodes = (lyxp_set_node *)0x0;
    local_a8.val._8_8_ = 0;
    local_a8.used = 0;
    local_a8.size = 0;
    local_a8.ht = (hash_table *)0x0;
    local_a8.ctx_pos = 0;
    local_a8.ctx_size = 0;
    local_a8._56_8_ = 0;
    set_fill_set((lyxp_set *)auStack_f8,set);
    iVar7 = eval_expr_select(local_40,exp_idx,LYXP_EXPR_AND,cur_node,param_5,local_38,options);
    if (iVar7 != 0) goto LAB_00176bfc;
    if ((options & 0x1cU) == 0 || local_38 == (lyxp_set *)0x0) {
      lyxp_set_cast(local_38,LYXP_SET_BOOLEAN,cur_node,local_50,options);
    }
    else {
      uVar18 = local_38->used;
      if ((ulong)uVar18 != 0) {
        lVar14 = 0;
        do {
          if (*(int *)((long)&((local_38->val).nodes)->pos + lVar14) == 1) {
            *(undefined4 *)((long)&((local_38->val).nodes)->pos + lVar14) = 0;
          }
          lVar14 = lVar14 + 0x10;
        } while ((ulong)uVar18 << 4 != lVar14);
      }
    }
    uVar18 = 1;
    if (1 < uVar21) {
      uVar18 = unaff_R12D;
    }
    local_58 = (ushort *)CONCAT44(local_58._4_4_,uVar18);
    sVar22 = 0;
    do {
      plVar24 = local_50;
      if (local_40->tokens[*exp_idx] != LYXP_TOKEN_OPERATOR_LOG) {
        __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_LOG",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x2033,
                      "int eval_and_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      pcVar17 = "skipped";
      if ((local_38 != (lyxp_set *)0x0) && (pcVar17 = "parsed", (local_38->val).bool == 0)) {
        pcVar17 = "skipped";
      }
      pcVar13 = print_token(LYXP_TOKEN_OPERATOR_LOG);
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_and_expr",pcVar17,pcVar13);
      cur_node = local_48;
      *exp_idx = *exp_idx + 1;
      if ((local_38 == (lyxp_set *)0x0) ||
         ((local_38->type == LYXP_SET_BOOLEAN && ((local_38->val).bool == 0)))) {
        iVar7 = eval_expr_select(local_40,exp_idx,LYXP_EXPR_AND,local_48,plVar24,(lyxp_set *)0x0,
                                 options);
        if (iVar7 != 0) goto LAB_00176bfc;
      }
      else {
        set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
        cur_node = local_48;
        iVar7 = eval_expr_select(local_40,exp_idx,LYXP_EXPR_AND,local_48,plVar24,&local_a8,options);
        plVar15 = local_38;
        if (iVar7 != 0) goto LAB_00176bfc;
        if (local_38->type == LYXP_SET_SNODE_SET) {
          if ((local_a8._32_8_ & 0xffffffff) != 0) {
            lVar14 = 0;
            do {
              if (*(int *)((long)&(local_a8.val.nodes)->pos + lVar14) == 1) {
                *(undefined4 *)((long)&(local_a8.val.nodes)->pos + lVar14) = 0;
              }
              lVar14 = lVar14 + 0x10;
            } while ((local_a8._32_8_ & 0xffffffff) << 4 != lVar14);
          }
          set_snode_merge(local_38,&local_a8);
        }
        else {
          lyxp_set_cast(&local_a8,LYXP_SET_BOOLEAN,cur_node,local_50,options);
          set_fill_set(plVar15,&local_a8);
        }
      }
      sVar22 = sVar22 + 1;
    } while (sVar22 != (short)local_58);
LAB_00177374:
    iVar7 = 0;
    goto LAB_00176bfc;
  case LYXP_EXPR_EQUALITY:
    if (uVar21 == 0) {
      __assert_fail("repeat",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1fc0,
                    "int eval_equality_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    orig_set.ht = (hash_table *)0x0;
    orig_set.ctx_pos = 0;
    orig_set.ctx_size = 0;
    orig_set.val._8_8_ = 0;
    orig_set.used = 0;
    orig_set.size = 0;
    orig_set._8_8_ = 0;
    orig_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_f8 = (undefined1  [8])0x0;
    orig_set.type = LYXP_SET_EMPTY;
    orig_set._4_4_ = 0;
    local_a8.type = LYXP_SET_EMPTY;
    local_a8._4_4_ = 0;
    local_a8._8_8_ = 0;
    local_a8.val.nodes = (lyxp_set_node *)0x0;
    local_a8.val._8_8_ = 0;
    local_a8.used = 0;
    local_a8.size = 0;
    local_a8.ht = (hash_table *)0x0;
    local_a8.ctx_pos = 0;
    local_a8.ctx_size = 0;
    local_a8._56_8_ = 0;
    set_fill_set((lyxp_set *)auStack_f8,set);
    iVar7 = eval_expr_select(local_40,exp_idx,LYXP_EXPR_EQUALITY,cur_node,param_5,local_38,options);
    if (iVar7 == 0) {
      pcVar17 = "parsed";
      if (local_38 == (lyxp_set *)0x0) {
        pcVar17 = "skipped";
      }
      iVar7 = 0;
      do {
        plVar5 = local_40;
        local_60 = (char *)CONCAT44(local_60._4_4_,iVar7);
        uVar16 = *exp_idx;
        if (local_40->tokens[uVar16] != LYXP_TOKEN_OPERATOR_COMP) {
          __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_COMP",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                        ,0x1fd0,
                        "int eval_equality_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                       );
        }
        ly_log_dbg(8,"%-27s %s %s[%u]","eval_equality_expr",pcVar17,"Operator(Comparison)");
        *exp_idx = *exp_idx + 1;
        if (local_38 == (lyxp_set *)0x0) {
          iVar7 = eval_expr_select(plVar5,exp_idx,LYXP_EXPR_EQUALITY,cur_node,local_50,
                                   (lyxp_set *)0x0,options);
          if (iVar7 != 0) {
            return iVar7;
          }
        }
        else {
          orig_set._56_8_ = (ulong)uVar16;
          set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
          iVar7 = eval_expr_select(plVar5,exp_idx,LYXP_EXPR_EQUALITY,cur_node,local_50,&local_a8,
                                   options);
          plVar5 = local_40;
          plVar24 = local_50;
          exp_idx = local_58;
          uVar4 = local_a8.val.nodes;
          uVar3 = orig_set._56_8_;
          cur_node = cur_node;
          if (iVar7 != 0) goto LAB_00176bfc;
          if ((options & 0x1cU) == 0) {
            if (((local_38->type == LYXP_SET_NODE_SET) &&
                (plVar2 = ((local_38->val).nodes)->node->schema,
                (plVar2->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)) &&
               ((*(int *)&plVar2[1].ref == 7 &&
                ((local_a8.type == LYXP_SET_STRING &&
                 (pcVar13 = strchr(local_a8.val.str,0x3a), pcVar13 == (char *)0x0)))))) {
              sVar10 = strlen(plVar24->name);
              sVar11 = strlen((char *)uVar4);
              plVar12 = (lyxp_set_node *)ly_realloc((void *)uVar4,sVar10 + sVar11 + 2);
              local_a8.val.str = (char *)plVar12;
              if (plVar12 == (lyxp_set_node *)0x0) {
                iVar7 = 0;
                cur_node = local_48;
                goto LAB_00176bfc;
              }
              sVar10 = strlen(plVar24->name);
              sVar11 = strlen((char *)plVar12);
              memmove((char *)((long)&plVar12->node + sVar10 + 1),plVar12,sVar11 + 1);
              plVar24 = local_50;
              uVar4 = local_a8.val.str;
              pcVar13 = local_50->name;
              sVar10 = strlen(pcVar13);
              memcpy((void *)uVar4,pcVar13,sVar10);
              uVar4 = local_a8.val.str;
              sVar10 = strlen(plVar24->name);
              *(char *)((long)&((lyxp_set_node *)uVar4)->node + sVar10) = ':';
            }
            cur_node = local_48;
            iVar7 = moveto_op_comp(local_38,&local_a8,local_40->expr + local_40->expr_pos[uVar3],
                                   local_48,plVar24,options);
            if (iVar7 != 0) {
              iVar7 = -1;
              goto LAB_00176bfc;
            }
          }
          else {
            equal_exp = orig_set._56_2_ - 1;
            warn_operands(local_50->ctx,local_38,&local_a8,0,local_40->expr,
                          local_40->expr_pos[orig_set._56_8_ + -1]);
            exp_idx = local_58;
            warn_equality_value(plVar24->ctx,plVar5,local_38,*local_58 - 1,equal_exp,*local_58 - 1);
            warn_equality_value(plVar24->ctx,plVar5,&local_a8,equal_exp,equal_exp,*exp_idx - 1);
            plVar15 = local_38;
            set_snode_merge(local_38,&local_a8);
            uVar9 = (ulong)plVar15->used;
            cur_node = local_48;
            if (uVar9 != 0) {
              lVar14 = 0;
              do {
                plVar12 = (plVar15->val).nodes;
                if (*(int *)((long)&plVar12->pos + lVar14) == 1) {
                  *(undefined4 *)((long)&plVar12->pos + lVar14) = 0;
                }
                lVar14 = lVar14 + 0x10;
              } while (uVar9 << 4 != lVar14);
            }
          }
        }
        iVar7 = (int)local_60 + 1;
      } while ((ushort)iVar7 != uVar21);
      iVar7 = 0;
      cur_node = cur_node;
    }
    goto LAB_00176bfc;
  case LYXP_EXPR_RELATIONAL:
    if (uVar21 == 0) {
      __assert_fail("repeat",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1f73,
                    "int eval_relational_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    orig_set.ht = (hash_table *)0x0;
    orig_set.ctx_pos = 0;
    orig_set.ctx_size = 0;
    orig_set.val._8_8_ = 0;
    orig_set.used = 0;
    orig_set.size = 0;
    orig_set._8_8_ = 0;
    orig_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_f8 = (undefined1  [8])0x0;
    orig_set.type = LYXP_SET_EMPTY;
    orig_set._4_4_ = 0;
    local_a8.type = LYXP_SET_EMPTY;
    local_a8._4_4_ = 0;
    local_a8._8_8_ = 0;
    local_a8.val.nodes = (lyxp_set_node *)0x0;
    local_a8.val._8_8_ = 0;
    local_a8.used = 0;
    local_a8.size = 0;
    local_a8.ht = (hash_table *)0x0;
    local_a8.ctx_pos = 0;
    local_a8.ctx_size = 0;
    local_a8._56_8_ = 0;
    set_fill_set((lyxp_set *)auStack_f8,set);
    iVar7 = eval_expr_select(local_40,exp_idx,LYXP_EXPR_RELATIONAL,cur_node,param_5,local_38,options
                            );
    if (iVar7 != 0) goto LAB_00176bfc;
    local_60 = "parsed";
    if (local_38 == (lyxp_set *)0x0) {
      local_60 = "skipped";
    }
    uVar16 = 0;
    do {
      plVar5 = local_40;
      uVar9 = (ulong)*exp_idx;
      if (local_40->tokens[uVar9] != LYXP_TOKEN_OPERATOR_COMP) {
        __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_COMP",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1f83,
                      "int eval_relational_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_relational_expr",local_60,"Operator(Comparison)");
      *exp_idx = *exp_idx + 1;
      if (local_38 == (lyxp_set *)0x0) {
        iVar7 = eval_expr_select(plVar5,exp_idx,LYXP_EXPR_RELATIONAL,local_48,local_50,
                                 (lyxp_set *)0x0,options);
        cur_node = local_48;
        if (iVar7 != 0) goto LAB_00176bfc;
      }
      else {
        set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
        iVar7 = eval_expr_select(plVar5,exp_idx,LYXP_EXPR_RELATIONAL,local_48,local_50,&local_a8,
                                 options);
        plVar15 = local_38;
        cur_node = local_48;
        if (iVar7 != 0) goto LAB_00176bfc;
        if ((options & 0x1cU) == 0) {
          iVar7 = moveto_op_comp(local_38,&local_a8,local_40->expr + local_40->expr_pos[uVar9],
                                 local_48,local_50,options);
          exp_idx = local_58;
          if (iVar7 != 0) goto LAB_00177398;
        }
        else {
          warn_operands(local_50->ctx,local_38,&local_a8,1,local_40->expr,
                        local_40->expr_pos[uVar9 - 1]);
          set_snode_merge(plVar15,&local_a8);
          uVar18 = plVar15->used;
          exp_idx = local_58;
          if ((ulong)uVar18 != 0) {
            lVar14 = 0;
            do {
              if (*(int *)((long)&((plVar15->val).nodes)->pos + lVar14) == 1) {
                *(undefined4 *)((long)&((plVar15->val).nodes)->pos + lVar14) = 0;
              }
              lVar14 = lVar14 + 0x10;
            } while ((ulong)uVar18 << 4 != lVar14);
          }
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar21);
    break;
  case LYXP_EXPR_ADDITIVE:
    if (uVar21 == 0) {
      __assert_fail("repeat",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1f24,
                    "int eval_additive_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    orig_set.ht = (hash_table *)0x0;
    orig_set.ctx_pos = 0;
    orig_set.ctx_size = 0;
    orig_set.val._8_8_ = 0;
    orig_set.used = 0;
    orig_set.size = 0;
    orig_set._8_8_ = 0;
    orig_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_f8 = (undefined1  [8])0x0;
    orig_set.type = LYXP_SET_EMPTY;
    orig_set._4_4_ = 0;
    local_a8.type = LYXP_SET_EMPTY;
    local_a8._4_4_ = 0;
    local_a8._8_8_ = 0;
    local_a8.val.nodes = (lyxp_set_node *)0x0;
    local_a8.val._8_8_ = 0;
    local_a8.used = 0;
    local_a8.size = 0;
    local_a8.ht = (hash_table *)0x0;
    local_a8.ctx_pos = 0;
    local_a8.ctx_size = 0;
    local_a8._56_8_ = 0;
    set_fill_set((lyxp_set *)auStack_f8,set);
    plVar15 = local_38;
    exp_idx_00 = local_58;
    iVar7 = eval_expr_select(local_40,local_58,LYXP_EXPR_ADDITIVE,cur_node,param_5,local_38,options)
    ;
    cur_node = local_48;
    if (iVar7 == 0) {
      local_60 = "parsed";
      if (plVar15 == (lyxp_set *)0x0) {
        local_60 = "skipped";
      }
      uVar9 = (ulong)*exp_idx_00;
      if (local_40->tokens[uVar9] == LYXP_TOKEN_OPERATOR_MATH) {
        sVar22 = 0;
        do {
          plVar5 = local_40;
          ly_log_dbg(8,"%-27s %s %s[%u]","eval_additive_expr",local_60,"Operator(Math)");
          *exp_idx_00 = *exp_idx_00 + 1;
          if (local_38 == (lyxp_set *)0x0) {
            iVar7 = eval_expr_select(plVar5,exp_idx_00,LYXP_EXPR_ADDITIVE,local_48,local_50,
                                     (lyxp_set *)0x0,options);
            cur_node = local_48;
            if (iVar7 != 0) goto LAB_00176bfc;
LAB_00176dcd:
            if (uVar21 <= (ushort)(sVar22 + 1U)) {
              iVar7 = 0;
              cur_node = local_48;
              goto LAB_00176bfc;
            }
          }
          else {
            set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
            iVar7 = eval_expr_select(plVar5,exp_idx_00,LYXP_EXPR_ADDITIVE,local_48,local_50,
                                     &local_a8,options);
            plVar15 = local_38;
            cur_node = local_48;
            if (iVar7 != 0) goto LAB_00176bfc;
            if ((options & 0x1cU) != 0) {
              warn_operands(local_50->ctx,local_38,&local_a8,1,local_40->expr,
                            local_40->expr_pos[uVar9 - 1]);
              set_snode_merge(plVar15,&local_a8);
              uVar18 = plVar15->used;
              exp_idx_00 = local_58;
              if ((ulong)uVar18 != 0) {
                lVar14 = 0;
                do {
                  if (*(int *)((long)&((plVar15->val).nodes)->pos + lVar14) == 1) {
                    *(undefined4 *)((long)&((plVar15->val).nodes)->pos + lVar14) = 0;
                  }
                  lVar14 = lVar14 + 0x10;
                } while ((ulong)uVar18 << 4 != lVar14);
              }
              goto LAB_00176dcd;
            }
            iVar8 = moveto_op_math(local_38,&local_a8,local_40->expr + local_40->expr_pos[uVar9],
                                   local_48,local_50,options);
            iVar7 = 0;
            cur_node = local_48;
            if ((iVar8 != 0) || (exp_idx_00 = local_58, uVar21 <= (ushort)(sVar22 + 1U)))
            goto LAB_00176bfc;
          }
          sVar22 = sVar22 + 1;
          uVar9 = (ulong)*exp_idx_00;
        } while (local_40->tokens[uVar9] == LYXP_TOKEN_OPERATOR_MATH);
      }
      __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_MATH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1f34,
                    "int eval_additive_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    goto LAB_00176bfc;
  case LYXP_EXPR_MULTIPLICATIVE:
    if (uVar21 == 0) {
      __assert_fail("repeat",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1ed6,
                    "int eval_multiplicative_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    orig_set.ht = (hash_table *)0x0;
    orig_set.ctx_pos = 0;
    orig_set.ctx_size = 0;
    orig_set.val._8_8_ = 0;
    orig_set.used = 0;
    orig_set.size = 0;
    orig_set._8_8_ = 0;
    orig_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_f8 = (undefined1  [8])0x0;
    orig_set.type = LYXP_SET_EMPTY;
    orig_set._4_4_ = 0;
    local_a8.type = LYXP_SET_EMPTY;
    local_a8._4_4_ = 0;
    local_a8._8_8_ = 0;
    local_a8.val.nodes = (lyxp_set_node *)0x0;
    local_a8.val._8_8_ = 0;
    local_a8.used = 0;
    local_a8.size = 0;
    local_a8.ht = (hash_table *)0x0;
    local_a8.ctx_pos = 0;
    local_a8.ctx_size = 0;
    local_a8._56_8_ = 0;
    set_fill_set((lyxp_set *)auStack_f8,set);
    iVar7 = eval_expr_select(local_40,exp_idx,LYXP_EXPR_MULTIPLICATIVE,cur_node,param_5,local_38,
                             options);
    if (iVar7 != 0) goto LAB_00176bfc;
    local_60 = "parsed";
    if (local_38 == (lyxp_set *)0x0) {
      local_60 = "skipped";
    }
    uVar16 = 0;
    do {
      plVar5 = local_40;
      uVar9 = (ulong)*exp_idx;
      if (local_40->tokens[uVar9] != LYXP_TOKEN_OPERATOR_MATH) {
        __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_MATH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1ee6,
                      "int eval_multiplicative_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_multiplicative_expr",local_60,"Operator(Math)");
      *exp_idx = *exp_idx + 1;
      if (local_38 == (lyxp_set *)0x0) {
        iVar7 = eval_expr_select(plVar5,exp_idx,LYXP_EXPR_MULTIPLICATIVE,local_48,local_50,
                                 (lyxp_set *)0x0,options);
        cur_node = local_48;
        if (iVar7 != 0) goto LAB_00176bfc;
      }
      else {
        set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
        iVar7 = eval_expr_select(plVar5,exp_idx,LYXP_EXPR_MULTIPLICATIVE,local_48,local_50,&local_a8
                                 ,options);
        plVar15 = local_38;
        cur_node = local_48;
        if (iVar7 != 0) goto LAB_00176bfc;
        if ((options & 0x1cU) == 0) {
          iVar7 = moveto_op_math(local_38,&local_a8,local_40->expr + local_40->expr_pos[uVar9],
                                 local_48,local_50,options);
          exp_idx = local_58;
          if (iVar7 != 0) goto LAB_00177398;
        }
        else {
          warn_operands(local_50->ctx,local_38,&local_a8,1,local_40->expr,
                        local_40->expr_pos[uVar9 - 1]);
          set_snode_merge(plVar15,&local_a8);
          uVar18 = plVar15->used;
          exp_idx = local_58;
          if ((ulong)uVar18 != 0) {
            lVar14 = 0;
            do {
              if (*(int *)((long)&((plVar15->val).nodes)->pos + lVar14) == 1) {
                *(undefined4 *)((long)&((plVar15->val).nodes)->pos + lVar14) = 0;
              }
              lVar14 = lVar14 + 0x10;
            } while ((ulong)uVar18 << 4 != lVar14);
          }
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar21);
    break;
  case LYXP_EXPR_UNARY:
    local_60 = (char *)uVar9;
    if (uVar21 == 0) {
      __assert_fail("repeat",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1e9f,
                    "int eval_unary_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    pcVar17 = "parsed";
    uVar18 = unaff_R12D;
    if (set == (lyxp_set *)0x0) {
      pcVar17 = "skipped";
    }
    do {
      uVar21 = *exp_idx;
      if (((local_40->used == uVar21) || (local_40->tokens[uVar21] != LYXP_TOKEN_OPERATOR_MATH)) ||
         (local_40->expr[local_40->expr_pos[uVar21]] != '-')) {
        __assert_fail("!exp_check_token(local_mod->ctx, exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0) && (exp->expr[exp->expr_pos[*exp_idx]] == \'-\')"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1ea4,
                      "int eval_unary_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      pcVar13 = print_token(local_40->tokens[uVar21]);
      exp_idx = local_58;
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_unary_expr",pcVar17,pcVar13,
                 (ulong)local_40->expr_pos[*local_58]);
      plVar15 = local_38;
      plVar5 = local_40;
      plVar24 = local_50;
      *exp_idx = *exp_idx + 1;
      uVar21 = (short)uVar18 - 1;
      uVar18 = (uint)uVar21;
    } while (uVar21 != 0);
    iVar7 = eval_expr_select(local_40,exp_idx,LYXP_EXPR_UNARY,local_48,local_50,local_38,options);
    if (iVar7 != 0) {
      return iVar7;
    }
    if ((unaff_R12D & 1) == 0 || plVar15 == (lyxp_set *)0x0) {
      return 0;
    }
    if ((options & 0x1cU) != 0) {
      warn_operands(plVar24->ctx,local_38,(lyxp_set *)0x0,1,plVar5->expr,
                    plVar5->expr_pos[(long)local_60]);
      return 0;
    }
    iVar7 = moveto_op_math(local_38,(lyxp_set *)0x0,plVar5->expr + plVar5->expr_pos[(long)local_60],
                           local_48,plVar24,options);
    if (iVar7 == 0) {
      return 0;
    }
    return -1;
  case LYXP_EXPR_UNION:
    if (uVar21 == 0) {
      __assert_fail("repeat",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x1e5b,
                    "int eval_union_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                   );
    }
    orig_set.ht = (hash_table *)0x0;
    orig_set.ctx_pos = 0;
    orig_set.ctx_size = 0;
    orig_set.val._8_8_ = 0;
    orig_set.used = 0;
    orig_set.size = 0;
    orig_set._8_8_ = 0;
    orig_set.val.nodes = (lyxp_set_node *)0x0;
    auStack_f8 = (undefined1  [8])0x0;
    orig_set.type = LYXP_SET_EMPTY;
    orig_set._4_4_ = 0;
    local_a8.type = LYXP_SET_EMPTY;
    local_a8._4_4_ = 0;
    local_a8._8_8_ = 0;
    local_a8.val.nodes = (lyxp_set_node *)0x0;
    local_a8.val._8_8_ = 0;
    local_a8.used = 0;
    local_a8.size = 0;
    local_a8.ht = (hash_table *)0x0;
    local_a8.ctx_pos = 0;
    local_a8.ctx_size = 0;
    local_a8._56_8_ = 0;
    set_fill_set((lyxp_set *)auStack_f8,set);
    iVar7 = eval_expr_select(local_40,exp_idx,LYXP_EXPR_UNION,cur_node,param_5,local_38,options);
    if (iVar7 != 0) goto LAB_00176bfc;
    local_58 = (ushort *)0x1a2dda;
    if (local_38 == (lyxp_set *)0x0) {
      local_58 = (ushort *)0x1bc552;
    }
    do {
      plVar5 = local_40;
      if (local_40->tokens[*exp_idx] != LYXP_TOKEN_OPERATOR_UNI) {
        __assert_fail("exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_UNI",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                      ,0x1e69,
                      "int eval_union_expr(struct lyxp_expr *, uint16_t *, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int)"
                     );
      }
      ly_log_dbg(8,"%-27s %s %s[%u]","eval_union_expr",local_58,"Operator(Union)");
      *exp_idx = *exp_idx + 1;
      if (local_38 == (lyxp_set *)0x0) {
        iVar7 = eval_expr_select(plVar5,exp_idx,LYXP_EXPR_UNION,local_48,local_50,(lyxp_set *)0x0,
                                 options);
        cur_node = local_48;
        if (iVar7 != 0) goto LAB_00176bfc;
      }
      else {
        set_fill_set(&local_a8,(lyxp_set *)auStack_f8);
        iVar7 = eval_expr_select(plVar5,exp_idx,LYXP_EXPR_UNION,local_48,local_50,&local_a8,options)
        ;
        cur_node = local_48;
        if (iVar7 != 0) goto LAB_00176bfc;
        if ((options & 0x1cU) == 0) {
          iVar7 = moveto_union(local_38,&local_a8,local_48,options);
          if (iVar7 != 0) goto LAB_00177398;
        }
        else {
          set_snode_merge(local_38,&local_a8);
        }
      }
      uVar21 = (short)unaff_R12D - 1;
      unaff_R12D = (uint)uVar21;
    } while (uVar21 != 0);
    break;
  default:
    if (param_5 == (lys_module *)0x0) {
      plVar20 = (ly_ctx *)0x0;
    }
    else {
      plVar20 = param_5->ctx;
    }
    ly_log(plVar20,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
           ,0x20eb);
    return -1;
  }
  iVar7 = 0;
  cur_node = local_48;
LAB_00176bfc:
  plVar24 = local_50;
  lyxp_set_cast((lyxp_set *)auStack_f8,LYXP_SET_EMPTY,cur_node,local_50,options);
  lyxp_set_cast(&local_a8,LYXP_SET_EMPTY,cur_node,plVar24,options);
  return iVar7;
LAB_00177398:
  iVar7 = -1;
  cur_node = local_48;
  goto LAB_00176bfc;
}

Assistant:

static int
eval_expr_select(struct lyxp_expr *exp, uint16_t *exp_idx, enum lyxp_expr_type etype, struct lyd_node *cur_node,
                 struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    int ret;
    uint16_t i, count;
    enum lyxp_expr_type next_etype;

    /* process operator repeats */
    if (!exp->repeat[*exp_idx]) {
        next_etype = LYXP_EXPR_NONE;
    } else {
        /* find etype repeat */
        for (i = 0; exp->repeat[*exp_idx][i] > etype; ++i);

        /* select one-priority lower because etype expression called us */
        if (i) {
            next_etype = exp->repeat[*exp_idx][i - 1];
            /* count repeats for that expression */
            for (count = 0; i && exp->repeat[*exp_idx][i - 1] == next_etype; ++count, --i);
        } else {
            next_etype = LYXP_EXPR_NONE;
        }
    }

    /* decide what expression are we parsing based on the repeat */
    switch (next_etype) {
    case LYXP_EXPR_OR:
        ret = eval_or_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_AND:
        ret = eval_and_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_EQUALITY:
        ret = eval_equality_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_RELATIONAL:
        ret = eval_relational_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_ADDITIVE:
        ret = eval_additive_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_MULTIPLICATIVE:
        ret = eval_multiplicative_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_UNARY:
        ret = eval_unary_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_UNION:
        ret = eval_union_expr(exp, exp_idx, count, cur_node, local_mod, set, options);
        break;
    case LYXP_EXPR_NONE:
        ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, set, options);
        break;
    default:
        ret = -1;
        LOGINT(local_mod ? local_mod->ctx : NULL);
        break;
    }

    return ret;
}